

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O0

string * __thiscall iDynTree::AccelerometerSensor::getName_abi_cxx11_(AccelerometerSensor *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,*(string **)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string AccelerometerSensor::getName() const
{
    return this->pimpl->name;
}